

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::items
          (QGraphicsSceneIndex *this,QPolygonF *polygon,ItemSelectionMode mode,SortOrder order,
          QTransform *deviceTransform)

{
  long lVar1;
  QList<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneIndexPrivate *d;
  QList<QGraphicsItem_*> *itemList;
  QPainterPath path;
  QRectF exposeRect;
  ItemSelectionMode mode_00;
  QTransform *viewTransform;
  QList<QGraphicsItem_*> *pQVar2;
  QGraphicsSceneIndexIntersector intersect;
  QRectF *rect;
  QGraphicsSceneIndexPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  d_func((QGraphicsSceneIndex *)0xa27760);
  mode_00 = (ItemSelectionMode)((ulong)pQVar2 >> 0x20);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa27794);
  pQVar2 = (QList<QGraphicsItem_*> *)0xffffffffffffffff;
  intersect = (QGraphicsSceneIndexIntersector)0xffffffffffffffff;
  rect = (QRectF *)0xffffffffffffffff;
  this_00 = (QGraphicsSceneIndexPrivate *)0xffffffffffffffff;
  QPolygonF::boundingRect();
  _q_adjustRect((QRectF *)0xa277dd);
  viewTransform = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&stack0xffffffffffffffd0);
  QPainterPath::addPolygon((QPolygonF *)&stack0xffffffffffffffd0);
  QGraphicsSceneIndexPrivate::items_helper
            (this_00,rect,intersect,pQVar2,viewTransform,mode_00,(SortOrder)polygon,this);
  QPainterPath::~QPainterPath((QPainterPath *)&stack0xffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::items(const QPolygonF &polygon, Qt::ItemSelectionMode mode,
                                                  Qt::SortOrder order, const QTransform &deviceTransform) const
{
    Q_D(const QGraphicsSceneIndex);
    QList<QGraphicsItem *> itemList;
    QRectF exposeRect = polygon.boundingRect();
    _q_adjustRect(&exposeRect);
    QPainterPath path;
    path.addPolygon(polygon);
    d->items_helper(exposeRect, &QtPrivate::intersect_path, &itemList, deviceTransform, mode, order, &path);
    return itemList;
}